

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aphy_impl.hpp
# Opt level: O0

ref<aphy::constraint_solver>
aphy::
makeObjectWithInterface<aphy::constraint_solver,APhyBullet::BulletConstraintSolver,btSequentialImpulseConstraintSolver*>
          (btSequentialImpulseConstraintSolver *args)

{
  ref_counter<aphy::constraint_solver> *this;
  pointer theCounter;
  Counter *in_RDI;
  unique_ptr<aphy::ref_counter<aphy::constraint_solver>,_std::default_delete<aphy::ref_counter<aphy::constraint_solver>_>_>
  counter;
  unique_ptr<APhyBullet::BulletConstraintSolver,_std::default_delete<APhyBullet::BulletConstraintSolver>_>
  object;
  pointer in_stack_ffffffffffffffa8;
  BulletConstraintSolver *in_stack_ffffffffffffffb0;
  ref_counter<aphy::constraint_solver> local_30 [2];
  
  ::operator_new(0x18);
  APhyBullet::BulletConstraintSolver::BulletConstraintSolver
            (in_stack_ffffffffffffffb0,(btConstraintSolver *)in_stack_ffffffffffffffa8);
  std::
  unique_ptr<APhyBullet::BulletConstraintSolver,std::default_delete<APhyBullet::BulletConstraintSolver>>
  ::unique_ptr<std::default_delete<APhyBullet::BulletConstraintSolver>,void>
            ((unique_ptr<APhyBullet::BulletConstraintSolver,_std::default_delete<APhyBullet::BulletConstraintSolver>_>
              *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this = (ref_counter<aphy::constraint_solver> *)::operator_new(0x18);
  std::
  unique_ptr<APhyBullet::BulletConstraintSolver,_std::default_delete<APhyBullet::BulletConstraintSolver>_>
  ::release((unique_ptr<APhyBullet::BulletConstraintSolver,_std::default_delete<APhyBullet::BulletConstraintSolver>_>
             *)0x12d406);
  ref_counter<aphy::constraint_solver>::ref_counter
            (this,&in_stack_ffffffffffffffa8->super_constraint_solver);
  std::
  unique_ptr<aphy::ref_counter<aphy::constraint_solver>,std::default_delete<aphy::ref_counter<aphy::constraint_solver>>>
  ::unique_ptr<std::default_delete<aphy::ref_counter<aphy::constraint_solver>>,void>
            ((unique_ptr<aphy::ref_counter<aphy::constraint_solver>,_std::default_delete<aphy::ref_counter<aphy::constraint_solver>_>_>
              *)this,local_30);
  theCounter = std::
               unique_ptr<aphy::ref_counter<aphy::constraint_solver>,_std::default_delete<aphy::ref_counter<aphy::constraint_solver>_>_>
               ::release((unique_ptr<aphy::ref_counter<aphy::constraint_solver>,_std::default_delete<aphy::ref_counter<aphy::constraint_solver>_>_>
                          *)0x12d431);
  ref<aphy::constraint_solver>::ref((ref<aphy::constraint_solver> *)in_RDI,theCounter);
  std::
  unique_ptr<aphy::ref_counter<aphy::constraint_solver>,_std::default_delete<aphy::ref_counter<aphy::constraint_solver>_>_>
  ::~unique_ptr((unique_ptr<aphy::ref_counter<aphy::constraint_solver>,_std::default_delete<aphy::ref_counter<aphy::constraint_solver>_>_>
                 *)this);
  std::
  unique_ptr<APhyBullet::BulletConstraintSolver,_std::default_delete<APhyBullet::BulletConstraintSolver>_>
  ::~unique_ptr((unique_ptr<APhyBullet::BulletConstraintSolver,_std::default_delete<APhyBullet::BulletConstraintSolver>_>
                 *)this);
  return (ref<aphy::constraint_solver>)in_RDI;
}

Assistant:

inline ref<I> makeObjectWithInterface(Args... args)
{
    std::unique_ptr<T> object(new T(args...));
    std::unique_ptr<ref_counter<I>> counter(new ref_counter<I> (object.release()));
    return ref<I> (counter.release());
}